

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_string_tests.cpp
# Opt level: O0

void __thiscall
util_string_tests::ConstevalFormatString_NumSpec::test_method(ConstevalFormatString_NumSpec *this)

{
  long lVar1;
  long in_FS_OFFSET;
  char *err_term;
  char *err_0_pos;
  char *err_num;
  char *err_mix;
  ConstevalFormatString<1U> fmt;
  char *in_stack_fffffffffffffd70;
  char *__str;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffd78;
  char *this_00;
  string_view in_stack_fffffffffffffec0;
  string_view in_stack_fffffffffffffed0;
  string_view in_stack_fffffffffffffee0;
  string_view in_stack_fffffffffffffef0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  fmt.fmt = "";
  PassFmt<0u>((ConstevalFormatString<0U>)0x1ccada1);
  PassFmt<0u>((ConstevalFormatString<0U>)fmt.fmt);
  PassFmt<1u>(fmt);
  PassFmt<0u>((ConstevalFormatString<0U>)fmt.fmt);
  PassFmt<0u>((ConstevalFormatString<0U>)fmt.fmt);
  PassFmt<1u>(fmt);
  PassFmt<1u>(fmt);
  PassFmt<0u>((ConstevalFormatString<0U>)fmt.fmt);
  PassFmt<1u>(fmt);
  PassFmt<1u>(fmt);
  PassFmt<2u>((ConstevalFormatString<2U>)fmt.fmt);
  PassFmt<2u>((ConstevalFormatString<2U>)fmt.fmt);
  PassFmt<129u>((ConstevalFormatString<129U>)fmt.fmt);
  PassFmt<1u>(fmt);
  PassFmt<1u>(fmt);
  PassFmt<1u>(fmt);
  PassFmt<1u>(fmt);
  PassFmt<1u>(fmt);
  PassFmt<1u>(fmt);
  PassFmt<1u>(fmt);
  PassFmt<1u>(fmt);
  PassFmt<1u>(fmt);
  PassFmt<1u>(fmt);
  PassFmt<1u>(fmt);
  PassFmt<1u>(fmt);
  PassFmt<1u>(fmt);
  PassFmt<2u>((ConstevalFormatString<2U>)fmt.fmt);
  PassFmt<1u>(fmt);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  FailFmtWithError<1u>(in_stack_fffffffffffffef0,in_stack_fffffffffffffee0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  FailFmtWithError<1u>(in_stack_fffffffffffffef0,in_stack_fffffffffffffee0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  FailFmtWithError<0u>(in_stack_fffffffffffffed0,in_stack_fffffffffffffec0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  FailFmtWithError<2u>(in_stack_fffffffffffffed0,in_stack_fffffffffffffec0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  FailFmtWithError<0u>(in_stack_fffffffffffffed0,in_stack_fffffffffffffec0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  FailFmtWithError<2u>(in_stack_fffffffffffffed0,in_stack_fffffffffffffec0);
  this_00 = "Positional format specifier must have position of at least 1";
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             "Positional format specifier must have position of at least 1",
             in_stack_fffffffffffffd70);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this_00,in_stack_fffffffffffffd70);
  FailFmtWithError<1u>(in_stack_fffffffffffffef0,in_stack_fffffffffffffee0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this_00,in_stack_fffffffffffffd70);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this_00,in_stack_fffffffffffffd70);
  FailFmtWithError<1u>(in_stack_fffffffffffffef0,in_stack_fffffffffffffee0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this_00,in_stack_fffffffffffffd70);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this_00,in_stack_fffffffffffffd70);
  FailFmtWithError<0u>(in_stack_fffffffffffffed0,in_stack_fffffffffffffec0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this_00,in_stack_fffffffffffffd70);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this_00,in_stack_fffffffffffffd70);
  FailFmtWithError<0u>(in_stack_fffffffffffffed0,in_stack_fffffffffffffec0);
  __str = "Format specifier incorrectly terminated by end of string";
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this_00,
             "Format specifier incorrectly terminated by end of string");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this_00,__str);
  FailFmtWithError<1u>(in_stack_fffffffffffffef0,in_stack_fffffffffffffee0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this_00,__str);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this_00,__str);
  FailFmtWithError<1u>(in_stack_fffffffffffffef0,in_stack_fffffffffffffee0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(ConstevalFormatString_NumSpec)
{
    PassFmt<0>("");
    PassFmt<0>("%%");
    PassFmt<1>("%s");
    PassFmt<0>("%%s");
    PassFmt<0>("s%%");
    PassFmt<1>("%%%s");
    PassFmt<1>("%s%%");
    PassFmt<0>(" 1$s");
    PassFmt<1>("%1$s");
    PassFmt<1>("%1$s%1$s");
    PassFmt<2>("%2$s");
    PassFmt<2>("%2$s 4$s %2$s");
    PassFmt<129>("%129$s 999$s %2$s");
    PassFmt<1>("%02d");
    PassFmt<1>("%+2s");
    PassFmt<1>("%.6i");
    PassFmt<1>("%5.2f");
    PassFmt<1>("%#x");
    PassFmt<1>("%1$5i");
    PassFmt<1>("%1$-5i");
    PassFmt<1>("%1$.5i");
    // tinyformat accepts almost any "type" spec, even '%', or '_', or '\n'.
    PassFmt<1>("%123%");
    PassFmt<1>("%123%s");
    PassFmt<1>("%_");
    PassFmt<1>("%\n");

    // The `*` specifier behavior is unsupported and can lead to runtime
    // errors when used in a ConstevalFormatString. Please refer to the
    // note in the ConstevalFormatString docs.
    PassFmt<1>("%*c");
    PassFmt<2>("%2$*3$d");
    PassFmt<1>("%.*f");

    auto err_mix{"Format specifiers must be all positional or all non-positional!"};
    FailFmtWithError<1>("%s%1$s", err_mix);

    auto err_num{"Format specifier count must match the argument count!"};
    FailFmtWithError<1>("", err_num);
    FailFmtWithError<0>("%s", err_num);
    FailFmtWithError<2>("%s", err_num);
    FailFmtWithError<0>("%1$s", err_num);
    FailFmtWithError<2>("%1$s", err_num);

    auto err_0_pos{"Positional format specifier must have position of at least 1"};
    FailFmtWithError<1>("%$s", err_0_pos);
    FailFmtWithError<1>("%$", err_0_pos);
    FailFmtWithError<0>("%0$", err_0_pos);
    FailFmtWithError<0>("%0$s", err_0_pos);

    auto err_term{"Format specifier incorrectly terminated by end of string"};
    FailFmtWithError<1>("%", err_term);
    FailFmtWithError<1>("%1$", err_term);
}